

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.h
# Opt level: O2

void sse::common::zero<float>(float *pDst,int len)

{
  for (; 0xf < len; len = len + -0x10) {
    pDst[0xc] = 0.0;
    pDst[0xd] = 0.0;
    pDst[0xe] = 0.0;
    pDst[0xf] = 0.0;
    pDst[8] = 0.0;
    pDst[9] = 0.0;
    pDst[10] = 0.0;
    pDst[0xb] = 0.0;
    pDst[4] = 0.0;
    pDst[5] = 0.0;
    pDst[6] = 0.0;
    pDst[7] = 0.0;
    pDst[0] = 0.0;
    pDst[1] = 0.0;
    pDst[2] = 0.0;
    pDst[3] = 0.0;
    pDst = pDst + 0x10;
  }
  if (7 < len) {
    len = len + -8;
    pDst[4] = 0.0;
    pDst[5] = 0.0;
    pDst[6] = 0.0;
    pDst[7] = 0.0;
    pDst[0] = 0.0;
    pDst[1] = 0.0;
    pDst[2] = 0.0;
    pDst[3] = 0.0;
    pDst = pDst + 8;
  }
  if (3 < len) {
    pDst[0] = 0.0;
    pDst[1] = 0.0;
    pDst[2] = 0.0;
    pDst[3] = 0.0;
    len = len + -4;
    pDst = pDst + 4;
  }
  for (; 0 < len; len = len + -1) {
    *pDst = 0.0;
    pDst = pDst + 1;
  }
  return;
}

Assistant:

_SIMD_SSE_T void zero(_T* pDst, int len)
        {
            set<_T>((_T)0, pDst, len);
        }